

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::CullingTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CullingTestInstance *this)

{
  undefined1 *this_00;
  pointer *this_01;
  pointer *this_02;
  deUint32 width;
  InstanceInterface *vk_00;
  NotSupportedError *this_03;
  TestContext *pTVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  TextureFormat *format;
  int *piVar4;
  allocator<char> local_6d1;
  string local_6d0;
  undefined4 local_6b0;
  allocator<char> local_6a9;
  string local_6a8;
  undefined1 local_688 [8];
  TriangleSceneSpec scene_2;
  PointSceneSpec scene_1;
  LineSceneSpec scene;
  bool isCompareOk;
  IVec4 colorBits;
  RasterizationArguments args;
  MessageBuilder local_490;
  MessageBuilder local_310;
  undefined1 local_18c [8];
  VkPhysicalDeviceFeatures deviceFeatures;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vk;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> lines;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_> points;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  CullingTestInstance *this_local;
  
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,width,width);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::vector((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            *)&points.
               super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  vector((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)&lines.
             super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::vector
            ((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              *)&vk);
  vk_00 = Context::getInstanceInterface
                    ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  deviceFeatures._212_8_ =
       Context::getPhysicalDevice
                 ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)local_18c,vk_00,(VkPhysicalDevice)deviceFeatures._212_8_);
  if ((deviceFeatures.depthClamp == 0) &&
     ((this->m_polygonMode == VK_POLYGON_MODE_LINE || (this->m_polygonMode == VK_POLYGON_MODE_POINT)
      ))) {
    this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_03,"Wireframe fill modes are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0x80c);
    __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  generateVertices(this,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &triangles.
                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  extractTriangles(this,(vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         *)&points.
                            super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &triangles.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (this->m_polygonMode == VK_POLYGON_MODE_LINE) {
    extractLines(this,(vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&points.
                          super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                  *)&vk);
  }
  else if (this->m_polygonMode == VK_POLYGON_MODE_POINT) {
    extractPoints(this,(vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                        *)&points.
                           super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                   *)&lines.
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pTVar1 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar2 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_310,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_310,(char (*) [23])"Setting front face to ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_frontFace);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_310);
  pTVar1 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar2 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_490,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_490,(char (*) [22])"Setting cull face to ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_cullMode);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_490);
  pTVar1 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar2 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&args.greenBits,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&args.greenBits,(char (*) [23])"Drawing test pattern (");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_primitiveTopology);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x12d99d9);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&args.greenBits);
  BaseRenderingTestInstance::drawPrimitives
            (&this->super_BaseRenderingTestInstance,
             (Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_primitiveTopology);
  format = BaseRenderingTestInstance::getTextureFormat(&this->super_BaseRenderingTestInstance);
  tcu::getTextureFormatBitDepth((tcu *)&scene.field_0x1c,format);
  scene.lineWidth._3_1_ = 0;
  colorBits.m_data[2] = this->m_multisampling & 1;
  colorBits.m_data[3] = (this->super_BaseRenderingTestInstance).m_subpixelBits;
  this_00 = &scene.field_0x1c;
  piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)this_00,0);
  args.numSamples = *piVar4;
  piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)this_00,1);
  args.subpixelBits = *piVar4;
  piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)this_00,2);
  args.redBits = *piVar4;
  if (this->m_polygonMode == VK_POLYGON_MODE_LINE) {
    this_01 = &scene_1.points.
               super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    tcu::LineSceneSpec::LineSceneSpec((LineSceneSpec *)this_01);
    scene.lines.
    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::swap
              ((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                *)this_01,
               (vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                *)&vk);
    pTVar1 = Context::getTestContext
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    scene.lineWidth._3_1_ =
         tcu::verifyLineGroupRasterization
                   ((Surface *)
                    &drawBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(LineSceneSpec *)this_01,
                    (RasterizationArguments *)(colorBits.m_data + 2),pTVar2);
    tcu::LineSceneSpec::~LineSceneSpec
              ((LineSceneSpec *)
               &scene_1.points.
                super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else if (this->m_polygonMode == VK_POLYGON_MODE_POINT) {
    this_02 = &scene_2.triangles.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    tcu::PointSceneSpec::PointSceneSpec((PointSceneSpec *)this_02);
    std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
    swap((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)this_02,
         (vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)&lines.
             super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pTVar1 = Context::getTestContext
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    scene.lineWidth._3_1_ =
         tcu::verifyPointGroupRasterization
                   ((Surface *)
                    &drawBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(PointSceneSpec *)this_02,
                    (RasterizationArguments *)(colorBits.m_data + 2),pTVar2);
    tcu::PointSceneSpec::~PointSceneSpec
              ((PointSceneSpec *)
               &scene_2.triangles.
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    tcu::TriangleSceneSpec::TriangleSceneSpec((TriangleSceneSpec *)local_688);
    std::
    vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ::swap((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            *)local_688,
           (vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            *)&points.
               super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pTVar1 = Context::getTestContext
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    scene.lineWidth._3_1_ =
         tcu::verifyTriangleGroupRasterization
                   ((Surface *)
                    &drawBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (TriangleSceneSpec *)local_688,(RasterizationArguments *)(colorBits.m_data + 2),
                    pTVar2,VERIFICATIONMODE_WEAK);
    tcu::TriangleSceneSpec::~TriangleSceneSpec((TriangleSceneSpec *)local_688);
  }
  if ((scene.lineWidth._3_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d0,"Incorrect rendering",&local_6d1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_6d0);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::allocator<char>::~allocator(&local_6d1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"Pass",&local_6a9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_6a8);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator(&local_6a9);
  }
  local_6b0 = 1;
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~vector((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> *)
          &vk);
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  ~vector((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
           *)&lines.
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~vector((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             *)&points.
                super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus CullingTestInstance::iterate (void)
{
	DE_ASSERT(m_polygonMode < VK_POLYGON_MODE_LAST);

	tcu::Surface									resultImage						(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;
	std::vector<PointSceneSpec::ScenePoint>			points;
	std::vector<LineSceneSpec::SceneLine>			lines;

	const InstanceInterface&						vk				= m_context.getInstanceInterface();
	const VkPhysicalDevice							physicalDevice	= m_context.getPhysicalDevice();
	const VkPhysicalDeviceFeatures					deviceFeatures	= getPhysicalDeviceFeatures(vk, physicalDevice);

	if (!(deviceFeatures.fillModeNonSolid) && (m_polygonMode == VK_POLYGON_MODE_LINE || m_polygonMode == VK_POLYGON_MODE_POINT))
		TCU_THROW(NotSupportedError, "Wireframe fill modes are not supported");

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	if (m_polygonMode == VK_POLYGON_MODE_LINE)
		extractLines(triangles ,lines);
	else if (m_polygonMode == VK_POLYGON_MODE_POINT)
		extractPoints(triangles, points);

	// draw image
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Setting front face to " << m_frontFace << tcu::TestLog::EndMessage;
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Setting cull face to " << m_cullMode << tcu::TestLog::EndMessage;
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Drawing test pattern (" << m_primitiveTopology << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitiveTopology);
	}

	// compare
	{
		RasterizationArguments	args;
		tcu::IVec4				colorBits	= tcu::getTextureFormatBitDepth(getTextureFormat());
		bool					isCompareOk	= false;

		args.numSamples		= m_multisampling ? 1 : 0;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= colorBits[0];
		args.greenBits		= colorBits[1];
		args.blueBits		= colorBits[2];

		switch (m_polygonMode)
		{
			case VK_POLYGON_MODE_LINE:
			{
				LineSceneSpec scene;
				scene.lineWidth = 0;
				scene.lines.swap(lines);
				isCompareOk = verifyLineGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());
				break;
			}
			case VK_POLYGON_MODE_POINT:
			{
				PointSceneSpec scene;
				scene.points.swap(points);
				isCompareOk = verifyPointGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());
				break;
			}
			default:
			{
				TriangleSceneSpec scene;
				scene.triangles.swap(triangles);
				isCompareOk = verifyTriangleGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog(), tcu::VERIFICATIONMODE_WEAK);
				break;
			}
		}

		if (isCompareOk)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rendering");
	}
}